

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O2

void cp_decl_func(CPState *cp,CPDecl *fdecl)

{
  ushort uVar1;
  int iVar2;
  CTypeID CVar3;
  CTypeID CVar4;
  CTypeID CVar5;
  int iVar6;
  CPDeclIdx CVar7;
  CTSize size;
  CTInfo info;
  CTState *cts;
  ulong uVar8;
  uint uVar9;
  CTypeID local_9e4;
  CType *ct;
  CPDecl decl;
  
  if (cp->tok == 0x29) {
    local_9e4._0_2_ = 0;
    uVar9 = 0x60000000;
    size = 0;
  }
  else {
    uVar8 = 0;
    local_9e4 = 0;
    size = 0;
    do {
      iVar6 = cp_opt(cp,0x2e);
      if (iVar6 != 0) {
        cp_check(cp,0x2e);
        cp_check(cp,0x2e);
        uVar9 = 0x60800000;
        goto LAB_0014642b;
      }
      cp_decl_spec(cp,&decl,0x80000);
      decl.mode = 6;
      cp_declarator(cp,&decl);
      CVar4 = cp_decl_intern(cp,&decl);
      cts = cp->cts;
      uVar9 = cts->tab[CVar4].info;
      ct = cts->tab + CVar4;
      if (uVar9 >> 0x1c == 4) {
        uVar9 = 0x60000000;
        goto LAB_0014642b;
      }
      if ((uVar9 & 0xfc000000) == 0x30000000) {
        info = uVar9 & 0xffff | 0x20030000;
LAB_0014637d:
        CVar4 = lj_ctype_intern(cts,info,8);
        cts = cp->cts;
      }
      else if (uVar9 >> 0x1c == 6) {
        info = (CVar4 | 0x30000) + 0x20000000;
        goto LAB_0014637d;
      }
      CVar5 = lj_ctype_new(cts,&ct);
      CVar3 = CVar5;
      if (local_9e4 != 0) {
        cp->cts->tab[uVar8].sib = (CTypeID1)CVar5;
        CVar3 = local_9e4;
      }
      local_9e4 = CVar3;
      if (decl.name != (GCstr *)0x0) {
        (decl.name)->marked = (decl.name)->marked | 0x20;
        (ct->name).gcptr64 = (uint64_t)decl.name;
      }
      ct->info = CVar4 + 0x90000000;
      ct->size = size;
      size = size + 1;
      iVar6 = cp_opt(cp,0x2c);
      uVar8 = (ulong)CVar5;
    } while (iVar6 != 0);
    uVar9 = 0x60000000;
LAB_0014642b:
  }
  cp_check(cp,0x29);
  iVar6 = cp_opt(cp,0x7b);
  if (iVar6 == 0) {
LAB_00146488:
    uVar1 = *(ushort *)((long)&fdecl->fattr + 2);
    fdecl->fattr = 0;
    CVar7 = cp_add(fdecl,(uint)uVar1 << 0x10 | uVar9,size);
    fdecl->stack[CVar7].sib = (CTypeID1)local_9e4;
    return;
  }
  *(byte *)&cp->mode = (byte)cp->mode | 0x20;
  iVar6 = 1;
  do {
    iVar2 = cp->tok;
    if (iVar2 == 0x7b) {
      iVar6 = iVar6 + 1;
    }
    else if (iVar2 == 0x7d) {
      iVar6 = iVar6 + -1;
      if (iVar6 == 0) {
        *(byte *)&cp->mode = (byte)cp->mode & 0xdf;
        cp->tok = 0x3b;
        goto LAB_00146488;
      }
    }
    else if (iVar2 == 0x103) {
      cp_err_token(cp,0x7d);
    }
    cp_next(cp);
  } while( true );
}

Assistant:

static void cp_decl_func(CPState *cp, CPDecl *fdecl)
{
  CTSize nargs = 0;
  CTInfo info = CTINFO(CT_FUNC, 0);
  CTypeID lastid = 0, anchor = 0;
  if (cp->tok != ')') {
    do {
      CPDecl decl;
      CTypeID ctypeid, fieldid;
      CType *ct;
      if (cp_opt(cp, '.')) {  /* Vararg function. */
	cp_check(cp, '.');  /* Workaround for the minimalistic lexer. */
	cp_check(cp, '.');
	info |= CTF_VARARG;
	break;
      }
      cp_decl_spec(cp, &decl, CDF_REGISTER);
      decl.mode = CPARSE_MODE_DIRECT|CPARSE_MODE_ABSTRACT;
      cp_declarator(cp, &decl);
      ctypeid = cp_decl_intern(cp, &decl);
      ct = ctype_raw(cp->cts, ctypeid);
      if (ctype_isvoid(ct->info))
	break;
      else if (ctype_isrefarray(ct->info))
	ctypeid = lj_ctype_intern(cp->cts,
	  CTINFO(CT_PTR, CTALIGN_PTR|ctype_cid(ct->info)), CTSIZE_PTR);
      else if (ctype_isfunc(ct->info))
	ctypeid = lj_ctype_intern(cp->cts,
	  CTINFO(CT_PTR, CTALIGN_PTR|ctypeid), CTSIZE_PTR);
      /* Add new parameter. */
      fieldid = lj_ctype_new(cp->cts, &ct);
      if (anchor)
	ctype_get(cp->cts, lastid)->sib = fieldid;
      else
	anchor = fieldid;
      lastid = fieldid;
      if (decl.name) ctype_setname(ct, decl.name);
      ct->info = CTINFO(CT_FIELD, ctypeid);
      ct->size = nargs++;
    } while (cp_opt(cp, ','));
  }
  cp_check(cp, ')');
  if (cp_opt(cp, '{')) {  /* Skip function definition. */
    int level = 1;
    cp->mode |= CPARSE_MODE_SKIP;
    for (;;) {
      if (cp->tok == '{') level++;
      else if (cp->tok == '}' && --level == 0) break;
      else if (cp->tok == CTOK_EOF) cp_err_token(cp, '}');
      cp_next(cp);
    }
    cp->mode &= ~CPARSE_MODE_SKIP;
    cp->tok = ';';  /* Ok for cp_decl_multi(), error in cp_decl_single(). */
  }
  info |= (fdecl->fattr & ~CTMASK_CID);
  fdecl->fattr = 0;
  fdecl->stack[cp_add(fdecl, info, nargs)].sib = anchor;
}